

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall kj::anon_unknown_9::DiskHandle::zero(DiskHandle *this,uint64_t offset,uint64_t size)

{
  bool bVar1;
  int osErrorNumber;
  WiderType<Decay<const_unsigned_long_&>,_Decay<unsigned_long_&>_> size_00;
  iovec *piVar2;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  ArrayPtr<iovec> AVar6;
  Fault local_260;
  Fault f_2;
  long *local_250;
  undefined1 local_248 [8];
  DebugComparison<long_&,_int> _kjCondition;
  Fault f_1;
  SyscallResult local_1ec;
  undefined1 auStack_1e8 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  size_t rem;
  size_t iovCount;
  iovec *item;
  iovec *__end2;
  iovec *__begin2;
  ArrayPtr<iovec> *__range2;
  ArrayPtr<iovec> iov;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  bool iov_isOnStack;
  size_t iov_size;
  size_t iovmax;
  size_t count;
  Fault local_50;
  Fault f;
  undefined1 auStack_40 [4];
  int error;
  uint64_t *local_38;
  uint64_t *local_30;
  int local_24;
  uint64_t uStack_20;
  int _kjSyscallError;
  uint64_t size_local;
  uint64_t offset_local;
  DiskHandle *this_local;
  
  local_38 = &size_local;
  local_30 = &stack0xffffffffffffffe0;
  _auStack_40 = this;
  uStack_20 = size;
  size_local = offset;
  offset_local = (uint64_t)this;
  f.exception._4_4_ =
       kj::_::Debug::
       syscallError<kj::(anonymous_namespace)::DiskHandle::zero(unsigned_long,unsigned_long)const::_lambda()_1_>
                 ((anon_class_24_3_f4ac2553 *)auStack_40,false);
  if (f.exception._4_4_ != 0) {
    local_24 = f.exception._4_4_;
    if (f.exception._4_4_ == 0x5f) {
      iovmax = uStack_20 + 0xfff >> 0xc;
      iov_size = 0x400;
      size_00 = min<unsigned_long_const&,unsigned_long&>(&iov_size,&iovmax);
      if (size_00 < 0x11) {
        Array<iovec>::Array((Array<iovec> *)&iov.size_,(void *)0x0);
        AVar6 = arrayPtr<iovec>((iovec *)&iov_heap.disposer,size_00);
      }
      else {
        heapArray<iovec>((Array<iovec> *)&iov.size_,size_00);
        AVar6 = kj::Array::operator_cast_to_ArrayPtr((Array *)&iov.size_);
      }
      iov.ptr = (iovec *)AVar6.size_;
      __range2 = (ArrayPtr<iovec> *)AVar6.ptr;
      __end2 = ArrayPtr<iovec>::begin((ArrayPtr<iovec> *)&__range2);
      piVar2 = ArrayPtr<iovec>::end((ArrayPtr<iovec> *)&__range2);
      for (; __end2 != piVar2; __end2 = __end2 + 1) {
        __end2->iov_base = "";
        __end2->iov_len = 0x1000;
      }
      for (; uVar4 = uStack_20, uStack_20 != 0; uStack_20 = uStack_20 - (long)_auStack_1e8) {
        sVar3 = ArrayPtr<iovec>::size((ArrayPtr<iovec> *)&__range2);
        if (uVar4 < sVar3 << 0xc) {
          uVar4 = uStack_20 & 0xfff;
          if (uVar4 != 0) {
            piVar2 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)&__range2,uStack_20 >> 0xc);
            piVar2->iov_len = uVar4;
          }
        }
        else {
          ArrayPtr<iovec>::size((ArrayPtr<iovec> *)&__range2);
        }
        f_1.exception = (Exception *)auStack_1e8;
        local_1ec = kj::_::Debug::
                    syscall<kj::(anonymous_namespace)::DiskHandle::zero(unsigned_long,unsigned_long)const::_lambda()_2_>
                              ((anon_class_40_5_3fb10c06 *)&f_1,false);
        pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1ec);
        if (pvVar5 == (void *)0x0) {
          osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_1ec);
          kj::_::Debug::Fault::Fault
                    ((Fault *)&_kjCondition.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x1c2,osErrorNumber,"n = pwritev(fd, iov.begin(), count, offset)","");
          kj::_::Debug::Fault::fatal((Fault *)&_kjCondition.result);
        }
        local_250 = (long *)kj::_::DebugExpressionStart::operator<<
                                      ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                       (long *)auStack_1e8);
        f_2.exception._4_4_ = 0;
        kj::_::DebugExpression<long&>::operator>
                  ((DebugComparison<long_&,_int> *)local_248,(DebugExpression<long&> *)&local_250,
                   (int *)((long)&f_2.exception + 4));
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_248);
        if (!bVar1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                    (&local_260,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x1c3,FAILED,"n > 0","_kjCondition,\"pwrite() returned zero?\"",
                     (DebugComparison<long_&,_int> *)local_248,
                     (char (*) [24])"pwrite() returned zero?");
          kj::_::Debug::Fault::fatal(&local_260);
        }
        size_local = (uint64_t)(_auStack_1e8 + size_local);
      }
      Array<iovec>::~Array((Array<iovec> *)&iov.size_);
    }
    else {
      kj::_::Debug::Fault::Fault
                (&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x19a,f.exception._4_4_,"fallocate(FALLOC_FL_PUNCH_HOLE)","");
      kj::_::Debug::Fault::~Fault(&local_50);
    }
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t size) const {
    // If FALLOC_FL_PUNCH_HOLE is defined, use it to efficiently zero the area.
    //
    // A fallocate() wrapper was only added to Android's Bionic C library as of API level 21,
    // but FALLOC_FL_PUNCH_HOLE is apparently defined in the headers before that, so we'll
    // have to explicitly test for that case.
#if defined(FALLOC_FL_PUNCH_HOLE) && !(__ANDROID__ && __BIONIC__ && __ANDROID_API__ < 21)
    KJ_SYSCALL_HANDLE_ERRORS(
        fallocate(fd, FALLOC_FL_PUNCH_HOLE | FALLOC_FL_KEEP_SIZE, offset, size)) {
      case EOPNOTSUPP:
        // fall back to below
        break;
      default:
        KJ_FAIL_SYSCALL("fallocate(FALLOC_FL_PUNCH_HOLE)", error) { return; }
    } else {
      return;
    }
#endif

    static const byte ZEROS[4096] = { 0 };

#if __APPLE__ || __CYGWIN__ || (defined(__ANDROID__) && __ANDROID_API__ < 24)
    // Mac & Cygwin & Android API levels 23 and lower doesn't have pwritev().
    while (size > sizeof(ZEROS)) {
      write(offset, ZEROS);
      size -= sizeof(ZEROS);
      offset += sizeof(ZEROS);
    }
    write(offset, kj::arrayPtr(ZEROS, size));
#else
    // Use a 4k buffer of zeros amplified by iov to write zeros with as few syscalls as possible.
    size_t count = (size + sizeof(ZEROS) - 1) / sizeof(ZEROS);
    const size_t iovmax = miniposix::iovMax();
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(iovmax, count), 16, 256);

    for (auto& item: iov) {
      item.iov_base = const_cast<byte*>(ZEROS);
      item.iov_len = sizeof(ZEROS);
    }

    while (size > 0) {
      size_t iovCount;
      if (size >= iov.size() * sizeof(ZEROS)) {
        iovCount = iov.size();
      } else {
        iovCount = size / sizeof(ZEROS);
        size_t rem = size % sizeof(ZEROS);
        if (rem > 0) {
          iov[iovCount++].iov_len = rem;
        }
      }

      ssize_t n;
      KJ_SYSCALL(n = pwritev(fd, iov.begin(), count, offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");

      offset += n;
      size -= n;
    }
#endif
  }